

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mult.hpp
# Opt level: O3

void calc_mean_and_sd_<double,int,double>
               (size_t *ix_arr,size_t st,size_t end,size_t col_num,double *Xc,int *Xc_ind,
               int *Xc_indptr,double *x_sd,double *x_mean)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  int *piVar7;
  ulong *puVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong *puVar12;
  long lVar13;
  double dVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  double dVar17;
  double dVar18;
  double dVar19;
  undefined1 auVar20 [16];
  undefined4 uVar22;
  undefined1 auVar21 [16];
  ulong local_78;
  double local_68;
  
  lVar13 = (long)Xc_indptr[col_num];
  lVar4 = (long)Xc_indptr[col_num + 1];
  if (Xc_indptr[col_num] == Xc_indptr[col_num + 1]) {
    *x_sd = 0.0;
    *x_mean = 0.0;
    return;
  }
  puVar8 = ix_arr + st;
  puVar12 = ix_arr + end + 1;
  uVar5 = (long)puVar12 - (long)puVar8 >> 3;
  if (0 < (long)uVar5) {
    do {
      uVar9 = uVar5 >> 1;
      uVar6 = ~uVar9 + uVar5;
      uVar5 = uVar9;
      if ((puVar8 + uVar9 + 1)[-1] < (ulong)(long)Xc_ind[lVar13]) {
        puVar8 = puVar8 + uVar9 + 1;
        uVar5 = uVar6;
      }
    } while (0 < (long)uVar5);
  }
  if ((puVar8 != puVar12) && (lVar4 != lVar13)) {
    iVar2 = Xc_ind[lVar4 + -1];
    local_78 = (end - st) + 1;
    local_68 = 0.0;
    uVar5 = 0;
    dVar17 = 0.0;
    while (uVar6 = *puVar8, uVar6 <= (ulong)(long)iVar2) {
      piVar1 = Xc_ind + lVar13;
      iVar3 = *piVar1;
      if (iVar3 == (int)uVar6) {
        dVar14 = Xc[lVar13];
        if ((ulong)ABS(dVar14) < 0x7ff0000000000000) {
          dVar18 = dVar14;
          if (uVar5 != 0) {
            dVar18 = local_68;
          }
          uVar5 = uVar5 + 1;
          auVar20._8_4_ = (int)(uVar5 >> 0x20);
          auVar20._0_8_ = uVar5;
          auVar20._12_4_ = 0x45300000;
          local_68 = local_68 +
                     (dVar14 - local_68) /
                     ((auVar20._8_8_ - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)uVar5) - 4503599627370496.0));
          dVar17 = fma(dVar14 - local_68,dVar14 - dVar18,dVar17);
        }
        else {
          local_78 = local_78 - 1;
        }
        if ((puVar8 == ix_arr + end) || (lVar13 == lVar4 + -1)) break;
        piVar7 = piVar1 + 1;
        puVar8 = puVar8 + 1;
        uVar6 = (long)Xc_ind + (lVar4 * 4 - (long)piVar7) >> 2;
        if (0 < (long)uVar6) {
          do {
            uVar9 = uVar6 >> 1;
            uVar10 = ~uVar9 + uVar6;
            uVar6 = uVar9;
            if ((ulong)(long)piVar7[uVar9] < *puVar8) {
              piVar7 = piVar7 + uVar9 + 1;
              uVar6 = uVar10;
            }
          } while (0 < (long)uVar6);
        }
LAB_0017b95e:
        lVar13 = (long)piVar7 - (long)Xc_ind >> 2;
      }
      else {
        if (iVar3 <= (int)uVar6) {
          piVar7 = piVar1 + 1;
          uVar9 = (long)Xc_ind + (lVar4 * 4 - (long)(piVar1 + 1)) >> 2;
          while (0 < (long)uVar9) {
            uVar10 = uVar9 >> 1;
            uVar11 = ~uVar10 + uVar9;
            uVar9 = uVar10;
            if ((ulong)(long)piVar7[uVar10] < uVar6) {
              piVar7 = piVar7 + uVar10 + 1;
              uVar9 = uVar11;
            }
          }
          goto LAB_0017b95e;
        }
        puVar8 = puVar8 + 1;
        uVar6 = (long)puVar12 - (long)puVar8 >> 3;
        while (0 < (long)uVar6) {
          uVar9 = uVar6 >> 1;
          uVar10 = ~uVar9 + uVar6;
          uVar6 = uVar9;
          if ((puVar8 + uVar9 + 1)[-1] < (ulong)(long)iVar3) {
            puVar8 = puVar8 + uVar9 + 1;
            uVar6 = uVar10;
          }
        }
      }
      if ((puVar8 == puVar12) || (lVar13 == lVar4)) break;
    }
    if (uVar5 != 0) {
      uVar22 = (undefined4)(local_78 >> 0x20);
      if (uVar5 < local_78) {
        auVar15._8_4_ = (int)(uVar5 >> 0x20);
        auVar15._0_8_ = uVar5;
        auVar15._12_4_ = 0x45300000;
        dVar19 = (auVar15._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar5) - 4503599627370496.0);
        auVar21._8_4_ = uVar22;
        auVar21._0_8_ = local_78;
        auVar21._12_4_ = 0x45300000;
        dVar14 = (auVar21._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)local_78) - 4503599627370496.0);
        dVar18 = dVar19 / dVar14;
        dVar17 = dVar17 + (1.0 - dVar18) * dVar19 * local_68 * local_68;
        local_68 = local_68 * dVar18;
      }
      else {
        auVar16._8_4_ = uVar22;
        auVar16._0_8_ = local_78;
        auVar16._12_4_ = 0x45300000;
        dVar14 = (auVar16._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)local_78) - 4503599627370496.0);
      }
      *x_mean = local_68;
      dVar17 = SQRT(dVar17 / dVar14);
      goto LAB_0017ba6c;
    }
  }
  *x_mean = 0.0;
  dVar17 = 0.0;
LAB_0017ba6c:
  *x_sd = dVar17;
  return;
}

Assistant:

void calc_mean_and_sd_(size_t *restrict ix_arr, size_t st, size_t end, size_t col_num,
                      real_t_ *restrict Xc, sparse_ix *restrict Xc_ind, sparse_ix *restrict Xc_indptr,
                      double &restrict x_sd, double &restrict x_mean)
{
    /* ix_arr must be already sorted beforehand */
    if (Xc_indptr[col_num] == Xc_indptr[col_num + 1])
    {
        x_sd   = 0;
        x_mean = 0;
        return;
    }
    size_t st_col  = Xc_indptr[col_num];
    size_t end_col = Xc_indptr[col_num + 1] - 1;
    size_t curr_pos = st_col;
    size_t ind_end_col = (size_t) Xc_ind[end_col];
    size_t *ptr_st = std::lower_bound(ix_arr + st, ix_arr + end + 1, (size_t)Xc_ind[st_col]);

    size_t cnt = end - st + 1;
    size_t added = 0;
    real_t m = 0;
    real_t s = 0;
    real_t m_prev = 0;

    for (size_t *row = ptr_st;
         row != ix_arr + end + 1 && curr_pos != end_col + 1 && ind_end_col >= *row;
        )
    {
        if (Xc_ind[curr_pos] == (sparse_ix)(*row))
        {
            if (unlikely(is_na_or_inf(Xc[curr_pos])))
            {
                cnt--;
            }

            else
            {
                if (added == 0) m_prev = Xc[curr_pos];
                m += (Xc[curr_pos] - m) / (real_t)(++added);
                s  = std::fma(Xc[curr_pos] - m, Xc[curr_pos] - m_prev, s);
                m_prev = m;
            }

            if (row == ix_arr + end || curr_pos == end_col) break;
            curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *(++row)) - Xc_ind;
        }

        else
        {
            if (Xc_ind[curr_pos] > (sparse_ix)(*row))
                row = std::lower_bound(row + 1, ix_arr + end + 1, Xc_ind[curr_pos]);
            else
                curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *row) - Xc_ind;
        }
    }

    if (added == 0)
    {
        x_mean = 0;
        x_sd = 0;
        return;
    }

    /* Note: up to this point:
         m = sum(x)/nnz
         s = sum(x^2) - (1/nnz)*(sum(x)^2)
       Here the standard deviation is given by:
         sigma = (1/n)*(sum(x^2) - (1/n)*(sum(x)^2))
       The difference can be put to a closed form. */
    if (cnt > added)
    {
        s += square(m) * ((real_t)added * ((real_t)1 - (real_t)added/(real_t)cnt));
        m *= (real_t)added / (real_t)cnt;
    }

    x_mean = m;
    x_sd   = std::sqrt(s / (real_t)cnt);
}